

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int moveto_node(lyxp_set *set,lyd_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint32_t uVar5;
  int in_R9D;
  char *pcVar6;
  lyxp_node_type lVar7;
  ly_ctx *ctx;
  lyd_node *plVar8;
  lyxp_node_type local_54;
  lys_module *plStack_50;
  lyxp_node_type root_type;
  lyxp_node_type local_44;
  ly_ctx *local_40;
  char *local_38;
  
  uVar4 = (ulong)qname_len;
  if (set == (lyxp_set *)0x0) {
    return 0;
  }
  if (set->type == LYXP_SET_EMPTY) {
    return 0;
  }
  if (cur_node == (lyd_node *)0x0) {
    __assert_fail("cur_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x151f,
                  "int moveto_node(struct lyxp_set *, struct lyd_node *, const char *, uint16_t, int)"
                 );
  }
  local_40 = cur_node->schema->module->ctx;
  switch(set->type) {
  case LYXP_SET_EMPTY:
    pcVar6 = "empty";
    break;
  case LYXP_SET_NODE_SET:
    moveto_get_root(cur_node,options,&local_54);
    pcVar6 = strnchr(qname,0x3a,(uint)qname_len);
    ctx = local_40;
    if (pcVar6 == (char *)0x0) {
      if ((qname_len == 1) && (*qname == '*')) {
        plStack_50 = (lys_module *)0x0;
      }
      else {
        plStack_50 = lyd_node_module(cur_node);
        ctx = local_40;
      }
    }
    else {
      uVar2 = (int)pcVar6 - (int)qname;
      local_38 = (char *)(ulong)uVar2;
      plStack_50 = moveto_resolve_model(qname,(uint16_t)uVar2,local_40,(lys_node *)0x0,0,in_R9D);
      if (plStack_50 == (lys_module *)0x0) {
        ly_vlog(ctx,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,local_38,qname);
        return -1;
      }
      qname = qname + (long)(int)(uint)local_38 + 1;
      uVar4 = (ulong)(~(uint)local_38 + (uint)qname_len);
    }
    local_38 = lydict_insert(ctx,qname,uVar4 & 0xffff);
    if (set->used != 0) {
      uVar4 = 0;
      local_44 = local_54;
      do {
        plVar8 = (set->val).nodes[uVar4].node;
        if ((set->val).nodes[uVar4].type < LYXP_NODE_ELEM) {
          bVar1 = false;
          for (; plVar8 != (lyd_node *)0x0; plVar8 = plVar8->next) {
            uVar5 = options;
            iVar3 = moveto_node_check(plVar8,local_44,local_38,plStack_50,options);
            if (iVar3 == 0) {
              lVar7 = (lyxp_node_type)uVar4;
              if (bVar1) {
                set_insert_node(set,plVar8,0,LYXP_NODE_ELEM,lVar7);
              }
              else {
                set_replace_node(set,plVar8,2,lVar7,uVar5);
              }
              uVar4 = (ulong)(lVar7 + LYXP_NODE_ROOT_CONFIG);
              bVar1 = true;
            }
            else if (iVar3 == 1) {
LAB_0017fe03:
              lydict_remove(local_40,local_38);
              return 1;
            }
          }
        }
        else {
          bVar1 = false;
          if (((-1 < (char)plVar8->validity) &&
              (bVar1 = false,
              (plVar8->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) &&
             (plVar8 = plVar8->child, plVar8 != (lyd_node *)0x0)) {
            bVar1 = false;
            do {
              uVar5 = options;
              iVar3 = moveto_node_check(plVar8,local_44,local_38,plStack_50,options);
              if (iVar3 == 0) {
                lVar7 = (lyxp_node_type)uVar4;
                if (bVar1) {
                  set_insert_node(set,plVar8,0,LYXP_NODE_ELEM,lVar7);
                }
                else {
                  set_replace_node(set,plVar8,2,lVar7,uVar5);
                }
                uVar4 = (ulong)(lVar7 + LYXP_NODE_ROOT_CONFIG);
                bVar1 = true;
              }
              else if (iVar3 == 1) goto LAB_0017fe03;
              plVar8 = plVar8->next;
            } while (plVar8 != (lyd_node *)0x0);
          }
        }
        if (!bVar1) {
          set_remove_node(set,(uint)uVar4);
        }
      } while ((uint)uVar4 < set->used);
    }
    lydict_remove(local_40,local_38);
    return 0;
  case LYXP_SET_SNODE_SET:
    pcVar6 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar6 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar6 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar6 = "string";
    break;
  default:
    pcVar6 = (char *)0x0;
  }
  ly_vlog(local_40,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar6);
  return -1;
}

Assistant:

static int
moveto_node(struct lyxp_set *set, struct lyd_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    uint32_t i;
    int replaced, pref_len, ret;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    struct lyd_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    assert(cur_node);
    ctx = cur_node->schema->module->ctx;

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(ctx, LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    moveto_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        /* specific module */
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, NULL, 1, 0);
        if (!moveto_mod) {
            LOGVAL(ctx, LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else if ((qname[0] == '*') && (qname_len == 1)) {
        /* all modules - special case */
        moveto_mod = NULL;
    } else {
        /* content node module */
        moveto_mod = lyd_node_module(cur_node);
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    for (i = 0; i < set->used; ) {
        replaced = 0;

        if ((set->val.nodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.nodes[i].type == LYXP_NODE_ROOT)) {
            LY_TREE_FOR(set->val.nodes[i].node, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    /* pos filled later */
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }

        /* skip nodes without children - leaves, leaflists, anyxmls, and dummy nodes (ouput root will eval to true) */
        } else if (!(set->val.nodes[i].node->validity & LYD_VAL_INUSE)
                && !(set->val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {

            LY_TREE_FOR(set->val.nodes[i].node->child, sub) {
                ret = moveto_node_check(sub, root_type, name_dict, moveto_mod, options);
                if (!ret) {
                    if (!replaced) {
                        set_replace_node(set, sub, 0, LYXP_NODE_ELEM, i);
                        replaced = 1;
                    } else {
                        set_insert_node(set, sub, 0, LYXP_NODE_ELEM, i);
                    }
                    ++i;
                } else if (ret == EXIT_FAILURE) {
                    lydict_remove(ctx, name_dict);
                    return EXIT_FAILURE;
                }
            }
        }

        if (!replaced) {
            /* no match */
            set_remove_node(set, i);
        }
    }
    lydict_remove(ctx, name_dict);

    return EXIT_SUCCESS;
}